

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int lua_resume(lua_State *L,lua_State *from,int nargs,int *nresults)

{
  CallInfo **ppCVar1;
  ushort uVar2;
  CallInfo *pCVar3;
  uint uVar4;
  int errcode;
  anon_union_4_4_9d99d2d2_for_u2 aVar5;
  CallInfo **ppCVar6;
  StkId pSVar7;
  char *msg;
  int nargs_local;
  
  nargs_local = nargs;
  if (L->status == '\x01') {
LAB_00108001:
    if (from == (lua_State *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar2 = (ushort)from->nCcalls;
      uVar4 = (uint)uVar2;
      L->nCcalls = (uint)uVar2;
      if (199 < uVar2) {
        msg = "C stack overflow";
        goto LAB_00108022;
      }
    }
    L->nCcalls = uVar4 + 1;
    errcode = luaD_rawrunprotected(L,resume,&nargs_local);
    ppCVar1 = &L->ci;
    while (ppCVar6 = ppCVar1, 1 < errcode) {
      while( true ) {
        pCVar3 = *ppCVar6;
        if (pCVar3 == (CallInfo *)0x0) {
          L->status = (lu_byte)errcode;
          luaD_seterrorobj(L,errcode,(L->top).p);
          pSVar7 = (L->top).p;
          (L->ci->top).p = pSVar7;
          goto LAB_001080bf;
        }
        uVar2 = pCVar3->callstatus;
        if ((uVar2 & 0x10) != 0) break;
        ppCVar6 = &pCVar3->previous;
      }
      L->ci = pCVar3;
      pCVar3->callstatus = (ushort)(errcode << 10) | uVar2 & 0xe3ff;
      errcode = luaD_rawrunprotected(L,unroll,(void *)0x0);
    }
    if (errcode == 1) {
      aVar5 = (*ppCVar1)->u2;
    }
    else {
      pSVar7 = (L->top).p;
LAB_001080bf:
      aVar5.funcidx = (int)((ulong)((long)pSVar7 + (-0x10 - ((*ppCVar1)->func).offset)) >> 4);
    }
    *nresults = (int)aVar5;
  }
  else {
    if (L->status == '\0') {
      if (L->ci != &L->base_ci) {
        msg = "cannot resume non-suspended coroutine";
        goto LAB_00108022;
      }
      if ((long)(L->top).p + (-0x10 - (L->ci->func).offset) >> 4 != (long)nargs) goto LAB_00108001;
    }
    msg = "cannot resume dead coroutine";
LAB_00108022:
    resume_error(L,msg,nargs);
    errcode = 2;
  }
  return errcode;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs,
                                      int *nresults) {
  int status;
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    else if (L->top.p - (L->ci->func.p + 1) == nargs)  /* no function? */
      return resume_error(L, "cannot resume dead coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)  /* ended with errors? */
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  if (getCcalls(L) >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  L->nCcalls++;
  luai_userstateresume(L, nargs);
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  status = precover(L, status);
  if (l_likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = cast_byte(status);  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top.p);  /* push error message */
    L->ci->top.p = L->top.p;
  }
  *nresults = (status == LUA_YIELD) ? L->ci->u2.nyield
                                    : cast_int(L->top.p - (L->ci->func.p + 1));
  lua_unlock(L);
  return status;
}